

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O1

void __thiscall
JsUtil::
List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
::Reset(List<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
        *this)

{
  StatementAdjustmentRecord *buffer;
  
  buffer = (this->
           super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
           ).buffer.ptr;
  if (buffer != (StatementAdjustmentRecord *)0x0) {
    Memory::Recycler::ExplicitFreeLeaf
              ((this->
               super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
               ).alloc,buffer,(long)this->length << 3);
    (this->
    super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
    ).buffer.ptr = (StatementAdjustmentRecord *)0x0;
    (this->
    super_ReadOnlyList<Js::FunctionBody::StatementAdjustmentRecord,_Memory::Recycler,_DefaultComparer>
    ).count = 0;
    this->length = 0;
  }
  return;
}

Assistant:

void Reset()
        {
            if (this->buffer != nullptr)
            {
                auto freeFunc = AllocatorInfo::GetFreeFunc();
                AllocatorFree(this->alloc, freeFunc, this->buffer, sizeof(T) * length); // TODO: Better version of DeleteArray?

                this->buffer = nullptr;
                this->count = 0;
                length = 0;
            }
        }